

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_aa461::CreateJumpNotZero
                    (VmModule *module,SynBase *source,VmValue *value,VmValue *trueLabel,
                    VmValue *falseLabel)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  VmValue *in_stack_ffffffffffffffb8;
  VmValue *falseLabel_local;
  VmValue *trueLabel_local;
  VmValue *value_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&value->type,&VmType::Int);
  if (!bVar1) {
    __assert_fail("value->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2d9,
                  "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  bVar1 = VmType::operator==(&trueLabel->type,&VmType::Block);
  if (!bVar1) {
    __assert_fail("trueLabel->type == VmType::Block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2da,
                  "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  bVar1 = VmType::operator==(&falseLabel->type,&VmType::Block);
  if (!bVar1) {
    __assert_fail("falseLabel->type == VmType::Block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2db,
                  "VmValue *(anonymous namespace)::CreateJumpNotZero(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  type.structType = (TypeBase *)0x1e;
  type._0_8_ = VmType::Void.structType;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_aa461 *)module,(VmModule *)source,
                             (SynBase *)VmType::Void._0_8_,type,(VmInstructionType)value,trueLabel,
                             falseLabel,in_stack_ffffffffffffffb8);
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateJumpNotZero(VmModule *module, SynBase *source, VmValue *value, VmValue *trueLabel, VmValue *falseLabel)
	{
		assert(value->type == VmType::Int);
		assert(trueLabel->type == VmType::Block);
		assert(falseLabel->type == VmType::Block);

		return CreateInstruction(module, source, VmType::Void, VM_INST_JUMP_NZ, value, trueLabel, falseLabel);
	}